

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void MergeUVRow_C(uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uv,int width)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)width + -1;
  for (lVar2 = 0; lVar2 < lVar1; lVar2 = lVar2 + 2) {
    dst_uv[lVar2 * 2] = src_u[lVar2];
    dst_uv[lVar2 * 2 + 1] = src_v[lVar2];
    dst_uv[lVar2 * 2 + 2] = src_u[lVar2 + 1];
    dst_uv[lVar2 * 2 + 3] = src_v[lVar2 + 1];
  }
  if ((width & 1U) != 0) {
    dst_uv[lVar2 * 2] = src_u[lVar1];
    dst_uv[lVar2 * 2 + 1] = src_v[lVar1];
  }
  return;
}

Assistant:

void MergeUVRow_C(const uint8_t* src_u,
                  const uint8_t* src_v,
                  uint8_t* dst_uv,
                  int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = src_u[x];
    dst_uv[1] = src_v[x];
    dst_uv[2] = src_u[x + 1];
    dst_uv[3] = src_v[x + 1];
    dst_uv += 4;
  }
  if (width & 1) {
    dst_uv[0] = src_u[width - 1];
    dst_uv[1] = src_v[width - 1];
  }
}